

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

string * __thiscall
wabt::(anonymous_namespace)::CWriter::MangleName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name)

{
  CWriter CVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"Z_","",name.size_);
  if (name.data_ != (char *)0x0) {
    pcVar4 = (char *)0x0;
    do {
      CVar1 = this[(long)pcVar4];
      iVar3 = (int)(char)CVar1;
      iVar2 = isalnum(iVar3);
      if ((iVar3 == 0x5f) || (iVar3 != 0x5a && iVar2 != 0)) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        StringPrintf_abi_cxx11_(&local_50,"%02X",(ulong)(byte)CVar1);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      pcVar4 = pcVar4 + 1;
    } while (name.data_ != pcVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::MangleName(string_view name) {
  const char kPrefix = 'Z';
  std::string result = "Z_";

  if (!name.empty()) {
    for (char c : name) {
      if ((isalnum(c) && c != kPrefix) || c == '_') {
        result += c;
      } else {
        result += kPrefix;
        result += StringPrintf("%02X", static_cast<uint8_t>(c));
      }
    }
  }

  return result;
}